

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

void * IDACreate(SUNContext_conflict sunctx)

{
  long in_RDI;
  long lVar1;
  IDAMem IDA_mem;
  long *local_8;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,0,0x11b,"IDACreate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (long *)0x0;
  }
  else {
    local_8 = (long *)malloc(0x568);
    if (local_8 == (long *)0x0) {
      IDAProcessError((IDAMem)0x0,0,0x123,"IDACreate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                      ,"A memory request failed.");
      local_8 = (long *)0x0;
    }
    else {
      memset(local_8,0,0x568);
      *local_8 = in_RDI;
      local_8[1] = 0x3cb0000000000000;
      local_8[2] = 0;
      local_8[3] = 0;
      *(undefined4 *)(local_8 + 4) = 0;
      *(undefined4 *)(local_8 + 8) = 1;
      *(undefined4 *)((long)local_8 + 0x44) = 0;
      local_8[9] = 0;
      local_8[10] = 0;
      *(undefined4 *)(local_8 + 0x61) = 5;
      local_8[0x62] = 500;
      local_8[99] = 0;
      local_8[100] = 0;
      local_8[0x65] = 0x4000000000000000;
      local_8[0x66] = 0x3ff0000000000000;
      local_8[0x67] = 0x4000000000000000;
      local_8[0x69] = 0x3feccccccccccccd;
      local_8[0x68] = 0x3fe0000000000000;
      local_8[0x6a] = 0x3fd0000000000000;
      local_8[0x6b] = 0x3fd0000000000000;
      local_8[0x50] = 0;
      local_8[0x5e] = 0x3fd51eb851eb851f;
      *(undefined4 *)((long)local_8 + 0x304) = 10;
      *(undefined4 *)(local_8 + 0x60) = 10;
      *(undefined4 *)((long)local_8 + 0x5c) = 0;
      local_8[0x36] = 0;
      local_8[0x37] = 0;
      *(undefined4 *)(local_8 + 0xb) = 0;
      *(undefined4 *)(local_8 + 0x4b) = 0;
      local_8[0x84] = 0x3fd0000000000000;
      *(undefined4 *)((long)local_8 + 0x30c) = 5;
      local_8[0x48] = 0x3f6b089a02752547;
      *(undefined4 *)(local_8 + 0x45) = 5;
      *(undefined4 *)((long)local_8 + 0x22c) = 4;
      *(undefined4 *)(local_8 + 0x46) = 10;
      *(undefined4 *)((long)local_8 + 0x23c) = 100;
      *(undefined4 *)((long)local_8 + 0x224) = 0;
      lVar1 = SUNRpowerR(local_8[1],0x3fe55810624dd2f2);
      local_8[0x49] = lVar1;
      local_8[0x75] = 0x37;
      local_8[0x76] = 0x26;
      *(undefined4 *)((long)local_8 + 0x3c4) = 0;
      *(undefined4 *)(local_8 + 0x79) = 0;
      *(undefined4 *)((long)local_8 + 0x3cc) = 0;
      *(undefined4 *)(local_8 + 0x7a) = 0;
      local_8[0x7b] = 0;
      *(undefined4 *)(local_8 + 0x7c) = 0;
    }
  }
  return local_8;
}

Assistant:

void* IDACreate(SUNContext sunctx)
{
  IDAMem IDA_mem;

  /* Test inputs */
  if (sunctx == NULL)
  {
    IDAProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSG_NULL_SUNCTX);
    return (NULL);
  }

  IDA_mem = NULL;
  IDA_mem = (IDAMem)malloc(sizeof(struct IDAMemRec));
  if (IDA_mem == NULL)
  {
    IDAProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
    return (NULL);
  }

  /* Zero out ida_mem */
  memset(IDA_mem, 0, sizeof(struct IDAMemRec));

  IDA_mem->ida_sunctx = sunctx;

  /* Set unit roundoff in IDA_mem */
  IDA_mem->ida_uround = SUN_UNIT_ROUNDOFF;

  /* Set default values for integrator optional inputs */
  IDA_mem->ida_res            = NULL;
  IDA_mem->ida_user_data      = NULL;
  IDA_mem->ida_itol           = IDA_NN;
  IDA_mem->ida_atolmin0       = SUNTRUE;
  IDA_mem->ida_user_efun      = SUNFALSE;
  IDA_mem->ida_efun           = NULL;
  IDA_mem->ida_edata          = NULL;
  IDA_mem->ida_maxord         = MAXORD_DEFAULT;
  IDA_mem->ida_mxstep         = MXSTEP_DEFAULT;
  IDA_mem->ida_hmax_inv       = HMAX_INV_DEFAULT;
  IDA_mem->ida_hmin           = HMIN_DEFAULT;
  IDA_mem->ida_eta_max_fx     = ETA_MAX_FX_DEFAULT;
  IDA_mem->ida_eta_min_fx     = ETA_MIN_FX_DEFAULT;
  IDA_mem->ida_eta_max        = ETA_MAX_DEFAULT;
  IDA_mem->ida_eta_low        = ETA_LOW_DEFAULT;
  IDA_mem->ida_eta_min        = ETA_MIN_DEFAULT;
  IDA_mem->ida_eta_min_ef     = ETA_MIN_EF_DEFAULT;
  IDA_mem->ida_eta_cf         = ETA_CF_DEFAULT;
  IDA_mem->ida_hin            = ZERO;
  IDA_mem->ida_epcon          = EPCON;
  IDA_mem->ida_maxnef         = MXNEF;
  IDA_mem->ida_maxncf         = MXNCF;
  IDA_mem->ida_suppressalg    = SUNFALSE;
  IDA_mem->ida_id             = NULL;
  IDA_mem->ida_constraints    = NULL;
  IDA_mem->ida_constraintsSet = SUNFALSE;
  IDA_mem->ida_tstopset       = SUNFALSE;
  IDA_mem->ida_dcj            = DCJ_DEFAULT;

  /* set the saved value maxord_alloc */
  IDA_mem->ida_maxord_alloc = MAXORD_DEFAULT;

  /* Set default values for IC optional inputs */
  IDA_mem->ida_epiccon  = PT01 * EPCON;
  IDA_mem->ida_maxnh    = MAXNH;
  IDA_mem->ida_maxnj    = MAXNJ;
  IDA_mem->ida_maxnit   = MAXNI;
  IDA_mem->ida_maxbacks = MAXBACKS;
  IDA_mem->ida_lsoff    = SUNFALSE;
  IDA_mem->ida_steptol  = SUNRpowerR(IDA_mem->ida_uround, TWOTHIRDS);

  /* Initialize lrw and liw */
  IDA_mem->ida_lrw = 25 + 5 * MXORDP1;
  IDA_mem->ida_liw = 38;

  /* No mallocs have been done yet */
  IDA_mem->ida_VatolMallocDone       = SUNFALSE;
  IDA_mem->ida_constraintsMallocDone = SUNFALSE;
  IDA_mem->ida_idMallocDone          = SUNFALSE;
  IDA_mem->ida_MallocDone            = SUNFALSE;

  /* Initialize nonlinear solver variables */
  IDA_mem->NLS    = NULL;
  IDA_mem->ownNLS = SUNFALSE;

  /* Return pointer to IDA memory block */
  return ((void*)IDA_mem);
}